

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCASerialization.cpp
# Opt level: O3

bool __thiscall Js::ObjectPropertyEnumerator::MoveNext(ObjectPropertyEnumerator *this)

{
  ScriptContext *scriptContext;
  undefined8 in_RAX;
  JavascriptString *aValue;
  JavascriptString *pJVar1;
  Var pvVar2;
  undefined8 uStack_38;
  PropertyId propertyId;
  
  if (this->m_innerEnumerator == (JavascriptStaticEnumerator *)0x0) {
    return false;
  }
  scriptContext = (this->super_ScriptContextHolder).m_scriptContext;
  pJVar1 = (JavascriptString *)
           (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
           super_JavascriptLibraryBase).undefinedValue.ptr;
  uStack_38 = in_RAX;
  do {
    aValue = JavascriptStaticEnumerator::MoveAndGetNext
                       (this->m_innerEnumerator,(PropertyId *)((long)&uStack_38 + 4),
                        (PropertyAttributes *)0x0);
    if (aValue == (JavascriptString *)0x0) {
      this->m_innerEnumerator = (JavascriptStaticEnumerator *)0x0;
      return false;
    }
  } while (aValue == pJVar1);
  pJVar1 = VarTo<Js::JavascriptString>(aValue);
  this->m_name = pJVar1;
  if (uStack_38._4_4_ == -1) {
    pvVar2 = JavascriptOperators::OP_GetElementI(this->m_obj,aValue,scriptContext);
  }
  else {
    pvVar2 = JavascriptOperators::GetProperty
                       (this->m_obj,uStack_38._4_4_,scriptContext,(PropertyValueInfo *)0x0);
  }
  this->m_value = pvVar2;
  return true;
}

Assistant:

bool ObjectPropertyEnumerator::MoveNext()
    {
        if (m_innerEnumerator)
        {
            ScriptContext* scriptContext = this->GetScriptContext();
            Var undefined = scriptContext->GetLibrary()->GetUndefined();
            Var propertyName;
            PropertyId propertyId;

            while ((propertyName = m_innerEnumerator->MoveAndGetNext(propertyId)) != NULL)
            {
                if (propertyName != undefined) //There are some code paths in which GetCurrentIndex can return undefined
                {
                    m_name = VarTo<JavascriptString>(propertyName);

                    if (propertyId != Constants::NoProperty)
                    {
                        m_value = JavascriptOperators::GetProperty(m_obj, propertyId, scriptContext);
                    }
                    else
                    {
                        m_value = JavascriptOperators::OP_GetElementI(m_obj, propertyName, scriptContext);
                    }

                    return true;
                }
            }

            // No more properties, mark end
            m_innerEnumerator = NULL;
        }

        return false;
    }